

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O2

function<void_(TcpSocket_*)> * __thiscall
TcpSocket::BindFuncConEstablished
          (function<void_(TcpSocket_*)> *__return_storage_ptr__,TcpSocket *this,
          function<void_(TcpSocket_*)> *fClientConnected)

{
  BaseSocketImpl *pBVar1;
  long *plVar2;
  function<void_(TcpSocket_*)> local_40;
  
  pBVar1 = (this->super_BaseSocket).Impl_._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  std::function<void_(TcpSocket_*)>::function(&local_40,fClientConnected);
  (**(code **)(*plVar2 + 0xd8))(__return_storage_ptr__,plVar2,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(TcpSocket*)> TcpSocket::BindFuncConEstablished(std::function<void(TcpSocket*)> fClientConnected)
{
    return dynamic_cast<TcpSocketImpl*>(GetImpl())->BindFuncConEstablished(fClientConnected);
}